

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O2

void __thiscall
adios2::transport::ShmSystemV::Read(ShmSystemV *this,char *buffer,size_t size,size_t start)

{
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_90,"in call to Read",&local_91);
  CheckSizes(this,size,start,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_50,"read",&local_91);
  Transport::ProfilerStart(&this->super_Transport,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  memcpy(buffer,this->m_Buffer + start,size);
  std::__cxx11::string::string((string *)&local_70,"read",&local_91);
  Transport::ProfilerStop(&this->super_Transport,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void ShmSystemV::Read(char *buffer, size_t size, size_t start)
{
    CheckSizes(size, start, "in call to Read");
    ProfilerStart("read");
    std::memcpy(buffer, &m_Buffer[start], size);
    ProfilerStop("read");
}